

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

Type __thiscall ON_ModelComponentTypeIterator::PreviousType(ON_ModelComponentTypeIterator *this)

{
  Type TVar1;
  ON_ModelComponentTypeIterator *this_local;
  
  if (0 < this->m_type_count) {
    if (this->m_current_index == -0x7fffffff) {
      this->m_current_index = this->m_type_count + -1;
    }
    else if (-1 < this->m_current_index) {
      this->m_current_index = this->m_current_index + -1;
    }
  }
  TVar1 = CurrentType(this);
  return TVar1;
}

Assistant:

ON_ModelComponent::Type ON_ModelComponentTypeIterator::PreviousType()
{
  if (m_type_count > 0)
  {
    if (ON_UNSET_INT_INDEX == m_current_index)
      m_current_index = m_type_count-1;
    else if (m_current_index >= 0)
      m_current_index--;
  }
  return CurrentType();
}